

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O2

float wabt::interp::FloatSqrt<float>(float val)

{
  float fVar1;
  
  if (val < 0.0) {
    fVar1 = sqrtf(val);
  }
  else {
    fVar1 = SQRT(val);
  }
  if (NAN(fVar1)) {
    fVar1 = NAN;
  }
  return fVar1;
}

Assistant:

T WABT_VECTORCALL FloatSqrt(T val) { return CanonNaN(std::sqrt(val)); }